

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputcontrol_p.h
# Opt level: O1

void __thiscall QInputControl::~QInputControl(QInputControl *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x18);
  return;
}

Assistant:

class Q_GUI_EXPORT QInputControl : public QObject
{
    Q_OBJECT
public:
    enum Type {
        LineEdit,
        TextEdit
    };

    explicit QInputControl(Type type, QObject *parent = nullptr);

    bool isAcceptableInput(const QKeyEvent *event) const;
    static bool isCommonTextEditShortcut(const QKeyEvent *ke);

protected:
    explicit QInputControl(Type type, QObjectPrivate &dd, QObject *parent = nullptr);

private:
    const Type m_type;
}